

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_service_interface(t_cpp_generator *this,t_service *tservice,string *style)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  bool bVar3;
  ostream *poVar4;
  t_function *ptVar5;
  pointer pptVar6;
  string extends;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string service_if_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __lhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+(&extends,__lhs,style);
  std::operator+(&service_if_name,&extends,"If");
  std::__cxx11::string::~string((string *)&extends);
  bVar3 = std::operator==(style,"CobCl");
  if (bVar3) {
    std::operator+(&extends,__lhs,"CobClient");
    if (this->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&extends);
      std::__cxx11::string::append((char *)&service_if_name);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
      poVar4 = std::operator<<(poVar4,"template <class Protocol_>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
    poVar4 = std::operator<<(poVar4,"class ");
    poVar4 = std::operator<<(poVar4,(string *)&extends);
    poVar4 = std::operator<<(poVar4,";");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&extends);
  }
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&local_118);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_90,this,&tservice->extends_->super_t_type,false,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions,
                   " : virtual public ",&local_90);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions,
                   style);
    std::operator+(&local_118,&local_b0,"If");
    std::__cxx11::string::operator=((string *)&extends,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&functions);
    std::__cxx11::string::~string((string *)&local_90);
    bVar3 = std::operator==(style,"CobCl");
    if ((bVar3) && (this->gen_templates_ == true)) {
      std::__cxx11::string::append((char *)&extends);
    }
  }
  bVar3 = std::operator==(style,"CobCl");
  if ((bVar3) && (this->gen_templates_ == true)) {
    poVar4 = std::operator<<((ostream *)&this->f_header_,"template <class Protocol_>");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  poVar1 = &this->f_header_;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,poVar1,tservice);
  poVar4 = std::operator<<((ostream *)poVar1,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&service_if_name);
  poVar4 = std::operator<<(poVar4,(string *)&extends);
  poVar4 = std::operator<<(poVar4," {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_118);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)&service_if_name);
  poVar4 = std::operator<<(poVar4,"() {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_118);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar6 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar6 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    ptVar5 = *pptVar6;
    if ((ptVar5->super_t_doc).has_doc_ == true) {
      std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
      ptVar5 = *pptVar6;
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])(this,poVar1,ptVar5);
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_118);
    poVar4 = std::operator<<(poVar4,"virtual ");
    ptVar5 = *pptVar6;
    std::__cxx11::string::string((string *)&local_50,(string *)style);
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_90);
    function_signature(&local_b0,this,ptVar5,&local_50,&local_70,true);
    poVar4 = std::operator<<(poVar4,(string *)&local_b0);
    poVar4 = std::operator<<(poVar4," = 0;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_118);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar4 = std::operator<<((ostream *)poVar1,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar3 = std::operator==(style,"CobCl");
  if ((bVar3) && (this->gen_templates_ == true)) {
    poVar4 = std::operator<<((ostream *)poVar1,"typedef ");
    poVar4 = std::operator<<(poVar4,(string *)&service_if_name);
    poVar4 = std::operator<<(poVar4,"< ::apache::thrift::protocol::TProtocol> ");
    poVar4 = std::operator<<(poVar4,(string *)__lhs);
    poVar4 = std::operator<<(poVar4,(string *)style);
    poVar4 = std::operator<<(poVar4,"If;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  std::__cxx11::string::~string((string *)&extends);
  std::__cxx11::string::~string((string *)&service_if_name);
  return;
}

Assistant:

void t_cpp_generator::generate_service_interface(t_service* tservice, string style) {

  string service_if_name = service_name_ + style + "If";
  if (style == "CobCl") {
    // Forward declare the client.
    string client_name = service_name_ + "CobClient";
    if (gen_templates_) {
      client_name += "T";
      service_if_name += "T";
      indent(f_header_) << "template <class Protocol_>" << endl;
    }
    indent(f_header_) << "class " << client_name << ";" << endl << endl;
  }

  string extends = "";
  if (tservice->get_extends() != nullptr) {
    extends = " : virtual public " + type_name(tservice->get_extends()) + style + "If";
    if (style == "CobCl" && gen_templates_) {
      // TODO(simpkins): If gen_templates_ is enabled, we currently assume all
      // parent services were also generated with templates enabled.
      extends += "T<Protocol_>";
    }
  }

  if (style == "CobCl" && gen_templates_) {
    f_header_ << "template <class Protocol_>" << endl;
  }

  generate_java_doc(f_header_, tservice);

  f_header_ << "class " << service_if_name << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "virtual ~" << service_if_name << "() {}" << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    if ((*f_iter)->has_doc())
      f_header_ << endl;
    generate_java_doc(f_header_, *f_iter);
    f_header_ << indent() << "virtual " << function_signature(*f_iter, style) << " = 0;" << endl;
  }
  indent_down();
  f_header_ << "};" << endl << endl;

  if (style == "CobCl" && gen_templates_) {
    // generate a backwards-compatible typedef for clients that do not
    // know about the new template-style code
    f_header_ << "typedef " << service_if_name << "< ::apache::thrift::protocol::TProtocol> "
              << service_name_ << style << "If;" << endl << endl;
  }
}